

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int compare_socket_address(sockaddr *x,sockaddr *y)

{
  ulong uVar1;
  bool bVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  ushort uVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar3 = x->sa_family;
  if (uVar3 != y->sa_family) {
    return -(uint)(uVar3 < y->sa_family) | 1;
  }
  if (uVar3 == 0) {
    return 1;
  }
  if (uVar3 == 10) {
    uVar8 = *(ulong *)(x->sa_data + 6);
    uVar5 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
            (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
            (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
    uVar8 = *(ulong *)(y->sa_data + 6);
    uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
            (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
            (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
    if (uVar5 == uVar8) {
      uVar8._0_2_ = x[1].sa_family;
      uVar8._2_1_ = x[1].sa_data[0];
      uVar8._3_1_ = x[1].sa_data[1];
      uVar8._4_1_ = x[1].sa_data[2];
      uVar8._5_1_ = x[1].sa_data[3];
      uVar8._6_1_ = x[1].sa_data[4];
      uVar8._7_1_ = x[1].sa_data[5];
      uVar1._0_2_ = y[1].sa_family;
      uVar1._2_1_ = y[1].sa_data[0];
      uVar1._3_1_ = y[1].sa_data[1];
      uVar1._4_1_ = y[1].sa_data[2];
      uVar1._5_1_ = y[1].sa_data[3];
      uVar1._6_1_ = y[1].sa_data[4];
      uVar1._7_1_ = y[1].sa_data[5];
      uVar5 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18
              | (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18
              | (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
      uVar8 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
              | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18
              | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
      uVar4 = 0;
      if (uVar5 != uVar8) goto LAB_0012168a;
    }
    else {
LAB_0012168a:
      uVar4 = -(uint)(uVar5 < uVar8) | 1;
    }
    if (uVar4 != 0) {
      bVar2 = false;
      goto LAB_001216e6;
    }
    uVar3 = *(ushort *)x->sa_data;
    uVar6 = *(ushort *)y->sa_data;
    if (uVar3 == uVar6) {
      uVar4 = *(uint *)(x->sa_data + 2);
      uVar7 = *(uint *)(y->sa_data + 2);
      if (uVar4 == uVar7) {
        uVar4 = *(uint *)(x[1].sa_data + 6);
        uVar7 = *(uint *)(y[1].sa_data + 6);
        if (uVar4 == uVar7) goto LAB_00121650;
      }
      goto LAB_001216a6;
    }
LAB_001216cf:
    bVar9 = (ushort)(uVar3 << 8 | uVar3 >> 8) < (ushort)(uVar6 << 8 | uVar6 >> 8);
  }
  else {
    if (uVar3 != 2) {
      __assert_fail("!\"unknown sa_family\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x13f3,"int compare_socket_address(struct sockaddr *, struct sockaddr *)");
    }
    uVar4 = *(uint *)(x->sa_data + 2);
    uVar7 = *(uint *)(y->sa_data + 2);
    if (uVar4 == uVar7) {
      uVar3 = *(ushort *)x->sa_data;
      uVar4 = (uint)uVar3;
      uVar6 = *(ushort *)y->sa_data;
      if (uVar3 == uVar6) {
LAB_00121650:
        bVar2 = true;
        goto LAB_001216e6;
      }
      goto LAB_001216cf;
    }
    uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
LAB_001216a6:
    bVar9 = uVar4 < uVar7;
  }
  bVar2 = false;
  uVar4 = -(uint)bVar9 | 1;
LAB_001216e6:
  if (!bVar2) {
    return uVar4;
  }
  return 0;
}

Assistant:

static int compare_socket_address(struct sockaddr *x, struct sockaddr *y)
{
#define CMP(a, b)                                                                                                                  \
    if (a != b)                                                                                                                    \
    return a < b ? -1 : 1

    CMP(x->sa_family, y->sa_family);

    if (x->sa_family == AF_INET) {
        struct sockaddr_in *xin = (void *)x, *yin = (void *)y;
        CMP(ntohl(xin->sin_addr.s_addr), ntohl(yin->sin_addr.s_addr));
        CMP(ntohs(xin->sin_port), ntohs(yin->sin_port));
    } else if (x->sa_family == AF_INET6) {
        struct sockaddr_in6 *xin6 = (void *)x, *yin6 = (void *)y;
        int r = memcmp(xin6->sin6_addr.s6_addr, yin6->sin6_addr.s6_addr, sizeof(xin6->sin6_addr.s6_addr));
        if (r != 0)
            return r;
        CMP(ntohs(xin6->sin6_port), ntohs(yin6->sin6_port));
        CMP(xin6->sin6_flowinfo, yin6->sin6_flowinfo);
        CMP(xin6->sin6_scope_id, yin6->sin6_scope_id);
    } else if (x->sa_family == AF_UNSPEC) {
        return 1;
    } else {
        assert(!"unknown sa_family");
    }

#undef CMP
    return 0;
}